

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

nodetest_t __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_node_test_type
          (xpath_parser *this,xpath_lexer_string *name)

{
  bool bVar1;
  xpath_lexer_string *this_00;
  undefined8 *in_RSI;
  char_t *in_stack_ffffffffffffffd8;
  
  this_00 = (xpath_lexer_string *)(ulong)((int)*(char *)*in_RSI - 99);
  switch(this_00) {
  case (xpath_lexer_string *)0x0:
    bVar1 = xpath_lexer_string::operator==(this_00,in_stack_ffffffffffffffd8);
    if (bVar1) {
      return nodetest_type_comment;
    }
    break;
  default:
    break;
  case (xpath_lexer_string *)0xb:
    bVar1 = xpath_lexer_string::operator==(this_00,in_stack_ffffffffffffffd8);
    if (bVar1) {
      return nodetest_type_node;
    }
    break;
  case (xpath_lexer_string *)0xd:
    bVar1 = xpath_lexer_string::operator==(this_00,in_stack_ffffffffffffffd8);
    if (bVar1) {
      return nodetest_type_pi;
    }
    break;
  case (xpath_lexer_string *)0x11:
    bVar1 = xpath_lexer_string::operator==(this_00,in_stack_ffffffffffffffd8);
    if (bVar1) {
      return nodetest_type_text;
    }
  }
  return nodetest_none;
}

Assistant:

nodetest_t parse_node_test_type(const xpath_lexer_string& name)
		{
			switch (name.begin[0])
			{
			case 'c':
				if (name == PUGIXML_TEXT("comment"))
					return nodetest_type_comment;

				break;

			case 'n':
				if (name == PUGIXML_TEXT("node"))
					return nodetest_type_node;

				break;

			case 'p':
				if (name == PUGIXML_TEXT("processing-instruction"))
					return nodetest_type_pi;

				break;

			case 't':
				if (name == PUGIXML_TEXT("text"))
					return nodetest_type_text;

				break;

			default:
				break;
			}

			return nodetest_none;
		}